

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::UnsafeShallowSwap(MapFieldBase *this,MapFieldBase *other)

{
  State SVar1;
  Arena *pAVar2;
  RepeatedPtrField<google::protobuf::Message> *pRVar3;
  LogMessage *other_00;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (this->arena_ != other->arena_) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
               ,100);
    other_00 = LogMessage::operator<<(&local_60,"CHECK failed: (arena_) == (other->arena_): ");
    LogFinisher::operator=(&local_61,other_00);
    LogMessage::~LogMessage(&local_60);
  }
  pAVar2 = this->arena_;
  this->arena_ = other->arena_;
  other->arena_ = pAVar2;
  pRVar3 = this->repeated_field_;
  this->repeated_field_ = other->repeated_field_;
  other->repeated_field_ = pRVar3;
  SVar1 = (other->state_)._M_i;
  (other->state_)._M_i = (this->state_)._M_i;
  (this->state_)._M_i = SVar1;
  return;
}

Assistant:

void MapFieldBase::UnsafeShallowSwap(MapFieldBase* other) {
  GOOGLE_DCHECK_EQ(arena_, other->arena_);
  InternalSwap(other);
}